

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModelHandle.cpp
# Opt level: O0

bool __thiscall
Rml::DataModelConstructor::BindEventCallback
          (DataModelConstructor *this,String *name,DataEventFunc *event_func)

{
  DataModel *this_00;
  bool bVar1;
  function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
  local_40;
  DataEventFunc *local_20;
  DataEventFunc *event_func_local;
  String *name_local;
  DataModelConstructor *this_local;
  
  this_00 = this->model;
  local_20 = event_func;
  event_func_local = (DataEventFunc *)name;
  name_local = (String *)this;
  ::std::
  function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
  ::function(&local_40,event_func);
  bVar1 = DataModel::BindEventCallback(this_00,name,&local_40);
  ::std::
  function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
  ::~function(&local_40);
  return bVar1;
}

Assistant:

bool DataModelConstructor::BindEventCallback(const String& name, DataEventFunc event_func)
{
	return model->BindEventCallback(name, std::move(event_func));
}